

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O2

int fetch_all_agencies_db(feed_db_t *db,agency_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  agency_t *paVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  uint local_33c;
  agency_t record;
  char qr [129];
  
  uVar2 = count_rows_db(db,"agency");
  if (0 < (int)uVar2) {
    memcpy(qr,
           "SELECT agency_id, agency_name,agency_url, agency_timezone,agency_lang, agency_phone,agency_fare_url, agency_email FROM `agency`;"
           ,0x81);
    sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
    paVar4 = (agency_t *)malloc((ulong)uVar2 * 0x280);
    *records = paVar4;
    uVar1 = 0xffffffff;
    if (paVar4 != (agency_t *)0x0) {
      lVar6 = 0;
      local_33c = uVar2;
      do {
        iVar3 = sqlite3_step(stmt);
        db->rc = iVar3;
        uVar1 = local_33c;
        if (iVar3 != 100) break;
        init_agency(&record);
        puVar5 = sqlite3_column_text(stmt,0);
        strcpy(record.id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,1);
        strcpy(record.name,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,2);
        strcpy(record.url,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,3);
        strcpy(record.timezone,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,4);
        strcpy(record.lang,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,5);
        strcpy(record.phone,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,6);
        strcpy(record.fare_url,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,7);
        strcpy(record.email,(char *)puVar5);
        memcpy((*records)->id + lVar6,&record,0x280);
        lVar6 = lVar6 + 0x280;
        uVar1 = local_33c;
      } while ((ulong)uVar2 * 0x280 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(stmt);
  }
  return uVar2;
}

Assistant:

int fetch_all_agencies_db(feed_db_t *db, agency_t **records) {

    agency_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "agency");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "agency_id, agency_name,"
                    "agency_url, agency_timezone,"
                    "agency_lang, agency_phone,"
                    "agency_fare_url, agency_email "
                "FROM `agency`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_agency(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.name, sqlite3_column_text(stmt, 1));
        strcpy(record.url, sqlite3_column_text(stmt, 2));
        strcpy(record.timezone, sqlite3_column_text(stmt, 3));
        strcpy(record.lang, sqlite3_column_text(stmt, 4));
        strcpy(record.phone, sqlite3_column_text(stmt, 5));
        strcpy(record.fare_url, sqlite3_column_text(stmt, 6));
        strcpy(record.email, sqlite3_column_text(stmt, 7));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}